

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O0

vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> * __thiscall
deqp::egl::ChooseConfigRandomCase::genRandomAttributes
          (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
           *__return_storage_ptr__,ChooseConfigRandomCase *this,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *attribSet,
          int numAttribs,Random *rnd)

{
  bool bVar1;
  AttribSpec AVar2;
  EGLint local_ac;
  pair<unsigned_int,_int> local_a8;
  AttribSpec *local_a0;
  __normal_iterator<deqp::egl::ChooseConfigRandomCase::AttribSpec_*,_std::vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>_>
  local_98;
  EGLenum local_90 [2];
  AttribSpec spec;
  iterator iStack_78;
  int attribNdx;
  _Self local_60;
  int local_54;
  undefined1 local_50 [4];
  int ndx;
  vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
  candidates;
  Random *rnd_local;
  int numAttribs_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *attribSet_local;
  ChooseConfigRandomCase *this_local;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *out;
  
  candidates.
  super__Vector_base<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::vector
            (__return_storage_ptr__);
  std::
  vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
  ::vector((vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
            *)local_50);
  for (local_54 = 0; local_54 < 0x16; local_54 = local_54 + 1) {
    local_60._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                   (attribSet,&genRandomAttributes::attributes[local_54].attribute);
    iStack_78 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                          (attribSet);
    bVar1 = std::operator!=(&local_60,&stack0xffffffffffffff88);
    if (bVar1) {
      std::
      vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
      ::push_back((vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
                   *)local_50,genRandomAttributes::attributes + local_54);
    }
  }
  for (spec.getValue._4_4_ = 0; spec.getValue._4_4_ < numAttribs;
      spec.getValue._4_4_ = spec.getValue._4_4_ + 1) {
    local_98._M_current =
         (AttribSpec *)
         std::
         vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
         ::begin((vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
                  *)local_50);
    local_a0 = (AttribSpec *)
               std::
               vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
               ::end((vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
                      *)local_50);
    AVar2 = de::Random::
            choose<deqp::egl::ChooseConfigRandomCase::AttribSpec,__gnu_cxx::__normal_iterator<deqp::egl::ChooseConfigRandomCase::AttribSpec*,std::vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>>>>
                      (rnd,local_98,
                       (__normal_iterator<deqp::egl::ChooseConfigRandomCase::AttribSpec_*,_std::vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>_>
                        )local_a0);
    spec._0_8_ = AVar2.getValue;
    local_90[0] = AVar2.attribute;
    local_ac = (*(code *)spec._0_8_)(rnd);
    local_a8 = std::make_pair<unsigned_int&,int>(local_90,&local_ac);
    std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
    push_back(__return_storage_ptr__,&local_a8);
  }
  candidates.
  super__Vector_base<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
  ::~vector((vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
             *)local_50);
  if ((candidates.
       super__Vector_base<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::
    ~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<EGLenum, EGLint> > genRandomAttributes (const std::set<EGLenum>& attribSet, int numAttribs, de::Random& rnd)
	{
		static const struct AttribSpec attributes[] =
		{
			{ EGL_BUFFER_SIZE,				ChooseConfigRandomCase::getInt<0, 32>,		},
			{ EGL_RED_SIZE,					ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_GREEN_SIZE,				ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_BLUE_SIZE,				ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_LUMINANCE_SIZE,			ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_ALPHA_SIZE,				ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_ALPHA_MASK_SIZE,			ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_BIND_TO_TEXTURE_RGB,		ChooseConfigRandomCase::getBool,			},
			{ EGL_BIND_TO_TEXTURE_RGBA,		ChooseConfigRandomCase::getBool,			},
			{ EGL_COLOR_BUFFER_TYPE,		ChooseConfigRandomCase::getBufferType,		},
			{ EGL_CONFIG_CAVEAT,			ChooseConfigRandomCase::getConfigCaveat,	},
//			{ EGL_CONFIG_ID,				0/*special*/,		},
			{ EGL_CONFORMANT,				ChooseConfigRandomCase::getApiBits,			},
			{ EGL_DEPTH_SIZE,				ChooseConfigRandomCase::getInt<0, 32>,		},
			{ EGL_LEVEL,					ChooseConfigRandomCase::getInt<0, 1>,		},
//			{ EGL_MATCH_NATIVE_PIXMAP,		EGL_NONE,			},
			{ EGL_MAX_SWAP_INTERVAL,		ChooseConfigRandomCase::getInt<0, 2>,		},
			{ EGL_MIN_SWAP_INTERVAL,		ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_NATIVE_RENDERABLE,		ChooseConfigRandomCase::getBool,			},
//			{ EGL_NATIVE_VISUAL_TYPE,		EGL_DONT_CARE,		},
			{ EGL_RENDERABLE_TYPE,			ChooseConfigRandomCase::getApiBits,			},
			{ EGL_SAMPLE_BUFFERS,			ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_SAMPLES,					ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_STENCIL_SIZE,				ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_SURFACE_TYPE,				ChooseConfigRandomCase::getSurfaceType,		},
//			{ EGL_TRANSPARENT_TYPE,			EGL_TRANSPARENT_RGB,},
//			{ EGL_TRANSPARENT_RED_VALUE,	ChooseConfigRandomCase::getInt<0, 255>,		},
//			{ EGL_TRANSPARENT_GREEN_VALUE,	ChooseConfigRandomCase::getInt<0, 255>,		},
//			{ EGL_TRANSPARENT_BLUE_VALUE,	ChooseConfigRandomCase::getInt<0, 255>,		}
		};

		std::vector<std::pair<EGLenum, EGLint> > out;

		// Build list to select from
		std::vector<AttribSpec> candidates;
		for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(attributes); ndx++)
		{
			if (attribSet.find(attributes[ndx].attribute) != attribSet.end())
				candidates.push_back(attributes[ndx]);
		}

		for (int attribNdx = 0; attribNdx < numAttribs; attribNdx++)
		{
			AttribSpec spec = rnd.choose<AttribSpec>(candidates.begin(), candidates.end());
			out.push_back(std::make_pair(spec.attribute, spec.getValue(rnd)));
		}

		return out;
	}